

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_double(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            double val,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  binary_stream_sink *this_00;
  size_t *psVar1;
  pointer psVar2;
  int iVar3;
  undefined7 in_register_00000031;
  long lVar4;
  float fVar5;
  uint8_t buf_1 [4];
  uint8_t buf [8];
  uint local_24;
  ulong local_20;
  
  iVar3 = (int)CONCAT71(in_register_00000031,tag);
  if (iVar3 == 7) {
    binary_stream_sink::push_back(&this->sink_,0xc1);
    if ((val != 0.0) || (NAN(val))) {
      val = val / 1000000000.0;
    }
  }
  else if (iVar3 == 6) {
    binary_stream_sink::push_back(&this->sink_,0xc1);
    if ((val != 0.0) || (NAN(val))) {
      val = val / 1000.0;
    }
  }
  else if (iVar3 == 5) {
    binary_stream_sink::push_back(&this->sink_,0xc1);
  }
  fVar5 = (float)val;
  this_00 = &this->sink_;
  if ((val != (double)fVar5) || (NAN(val) || NAN((double)fVar5))) {
    binary_stream_sink::push_back(this_00,0xfb);
    local_20 = (ulong)val >> 0x38 | ((ulong)val & 0xff000000000000) >> 0x28 |
               ((ulong)val & 0xff0000000000) >> 0x18 | ((ulong)val & 0xff00000000) >> 8 |
               ((ulong)val & 0xff000000) << 8 | ((ulong)val & 0xff0000) << 0x18 |
               ((ulong)val & 0xff00) << 0x28 | (long)val << 0x38;
    lVar4 = 0;
    do {
      binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_20 + lVar4));
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
  }
  else {
    binary_stream_sink::push_back(this_00,0xfa);
    local_24 = (uint)fVar5 >> 0x18 | ((uint)fVar5 & 0xff0000) >> 8 | ((uint)fVar5 & 0xff00) << 8 |
               (int)fVar5 << 0x18;
    lVar4 = 0;
    do {
      binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_24 + lVar4));
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  psVar2 = (this->stack_).
           super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar2) {
    psVar1 = &psVar2[-1].index_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double val, 
                      semantic_tag tag,
                      const ser_context&,
                      std::error_code&) override
    {
        switch (tag)
        {
            case semantic_tag::epoch_second:
                write_tag(1);
                break;
            case semantic_tag::epoch_milli:
                write_tag(1);
                if (val != 0)
                {
                    val /= millis_in_second;
                }
                break;
            case semantic_tag::epoch_nano:
                write_tag(1);
                if (val != 0)
                {
                    val /= nanos_in_second;
                }
                break;
            default:
                break;
        }

        float valf = (float)val;
        if ((double)valf == val)
        {
            binary::native_to_big(static_cast<uint8_t>(0xfa), 
                                  std::back_inserter(sink_));
            binary::native_to_big(valf, std::back_inserter(sink_));
        }
        else
        {
            binary::native_to_big(static_cast<uint8_t>(0xfb), 
                                  std::back_inserter(sink_));
            binary::native_to_big(val, std::back_inserter(sink_));
        }

        // write double

        end_value();
        JSONCONS_VISITOR_RETURN;
    }